

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

void __thiscall
libtorrent::torrent_info::rename_file(torrent_info *this,file_index_t index,string *new_filename)

{
  __type_conflict1 _Var1;
  allocator<char> local_69;
  string local_68;
  file_index_t local_44;
  string local_40;
  string *local_20;
  string *new_filename_local;
  torrent_info *this_local;
  file_index_t index_local;
  
  local_44.m_val = index.m_val;
  local_20 = new_filename;
  new_filename_local = (string *)this;
  this_local._4_4_ = index.m_val;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
  file_storage::file_path(&local_40,&this->m_files,local_44,&local_68);
  _Var1 = ::std::operator==(&local_40,local_20);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::allocator<char>::~allocator(&local_69);
  if (!_Var1) {
    copy_on_write(this);
    file_storage::rename_file(&this->m_files,this_local._4_4_,local_20);
  }
  return;
}

Assistant:

void torrent_info::rename_file(file_index_t index, std::string const& new_filename)
	{
		TORRENT_ASSERT(is_loaded());
		if (m_files.file_path(index) == new_filename) return;
		copy_on_write();
		m_files.rename_file(index, new_filename);
	}